

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O3

yajl_lexer yajl_lex_alloc(yajl_alloc_funcs *alloc,uint allowComments,uint validateUTF8)

{
  yajl_lexer pyVar1;
  yajl_buf pyVar2;
  
  pyVar1 = (yajl_lexer)(*alloc->malloc)(alloc->ctx,0x40);
  pyVar1->lineOff = 0;
  pyVar1->charOff = 0;
  *(undefined8 *)&pyVar1->error = 0;
  pyVar1->buf = (yajl_buf)0x0;
  pyVar1->bufOff = 0;
  pyVar1->bufInUse = 0;
  pyVar1->allowComments = 0;
  *(undefined8 *)&pyVar1->validateUTF8 = 0;
  pyVar1->alloc = (yajl_alloc_funcs *)0x0;
  pyVar2 = yajl_buf_alloc(alloc);
  pyVar1->buf = pyVar2;
  pyVar1->allowComments = allowComments;
  pyVar1->validateUTF8 = validateUTF8;
  pyVar1->alloc = alloc;
  return pyVar1;
}

Assistant:

yajl_lexer
yajl_lex_alloc(yajl_alloc_funcs * alloc,
               unsigned int allowComments, unsigned int validateUTF8)
{
    yajl_lexer lxr = (yajl_lexer) YA_MALLOC(alloc, sizeof(struct yajl_lexer_t));
    memset((void *) lxr, 0, sizeof(struct yajl_lexer_t));
    lxr->buf = yajl_buf_alloc(alloc);
    lxr->allowComments = allowComments;
    lxr->validateUTF8 = validateUTF8;
    lxr->alloc = alloc;
    return lxr;
}